

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

int __thiscall QLayout::spacing(QLayout *this)

{
  QLayoutPrivate *layout;
  undefined8 in_RDI;
  PixelMetric pm;
  QLayoutPrivate *d;
  int local_4;
  
  pm = (PixelMetric)((ulong)in_RDI >> 0x20);
  layout = d_func((QLayout *)0x33c7bc);
  if (layout->insideSpacing < 0) {
    local_4 = qSmartSpacing((QLayout *)layout,pm);
  }
  else {
    local_4 = layout->insideSpacing;
  }
  return local_4;
}

Assistant:

int QLayout::spacing() const
{
    Q_D(const QLayout);
    if (d->insideSpacing >=0) {
        return d->insideSpacing;
    } else {
        // arbitrarily prefer horizontal spacing to vertical spacing
        return qSmartSpacing(this, QStyle::PM_LayoutHorizontalSpacing);
    }
}